

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIfCommand.cxx
# Opt level: O3

string * cmIfCommandError_abi_cxx11_
                   (string *__return_storage_ptr__,
                   vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                   *args)

{
  string *psVar1;
  pointer str;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,"given arguments:\n ","");
  str = (args->
        super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>).
        _M_impl.super__Vector_impl_data._M_start;
  if (str != (args->
             super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
             )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      cmOutputConverter::EscapeForCMake(&local_50,&str->Value);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      str = str + 1;
    } while (str != (args->
                    super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                    )._M_impl.super__Vector_impl_data._M_finish);
  }
  psVar1 = (string *)std::__cxx11::string::append((char *)__return_storage_ptr__);
  return psVar1;
}

Assistant:

static std::string cmIfCommandError(
  std::vector<cmExpandedCommandArgument> const& args)
{
  std::string err = "given arguments:\n ";
  for(std::vector<cmExpandedCommandArgument>::const_iterator i = args.begin();
      i != args.end(); ++i)
    {
    err += " ";
    err += cmOutputConverter::EscapeForCMake(i->GetValue());
    }
  err += "\n";
  return err;
}